

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

dtree_node_t * get_node(dtree_node_t *node,uint32 id)

{
  dtree_node_t *pdVar1;
  
  while( true ) {
    if (node->node_id == id) {
      return node;
    }
    if ((node->y == (dtree_node_t *)0x0) && (node->n == (dtree_node_str *)0x0)) break;
    pdVar1 = get_node(node->y,id);
    if (pdVar1 != (dtree_node_t *)0x0) {
      return pdVar1;
    }
    node = node->n;
  }
  return (dtree_node_t *)0x0;
}

Assistant:

dtree_node_t *
get_node(dtree_node_t *node,
	 uint32 id)
{
    dtree_node_t *ret;

    if (node->node_id == id)
	return node;
    else if (!IS_LEAF(node)) {
	ret = get_node(node->y, id);
	if (ret != NULL)
	    return ret;
	ret = get_node(node->n, id);
	return ret;
    }
    else {
	/* it is a leaf and it doesn't match */
	return NULL;
    }
}